

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_chi2_test<trng::uniform01_dist<long_double>>
               (uniform01_dist<long_double> *d)

{
  bool bVar1;
  undefined1 x_00 [16];
  parameter_type P;
  StringRef capturedExpression;
  longdouble lVar2;
  ExprLhs<bool> EVar3;
  reference pvVar4;
  reference pvVar5;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar6;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  AssertionHandler catchAssertionHandler;
  double c2_p;
  vector<double,_std::allocator<double>_> p;
  int bin;
  result_type x;
  int i_1;
  lcg64_shift R;
  int i;
  vector<int,_std::allocator<int>_> count;
  vector<long_double,_std::allocator<long_double>_> quantil;
  int N;
  result_type dp;
  int bins;
  undefined4 in_stack_fffffffffffffe18;
  Flags in_stack_fffffffffffffe1c;
  undefined2 in_stack_fffffffffffffe20;
  undefined6 in_stack_fffffffffffffe22;
  StringRef *in_stack_fffffffffffffe28;
  undefined6 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe36;
  undefined1 in_stack_fffffffffffffe37;
  undefined1 uVar7;
  size_type in_stack_fffffffffffffe38;
  SourceLineInfo *this;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe40;
  double dVar8;
  ExprLhs<bool> *expr;
  AssertionHandler *this_00;
  longdouble in_stack_fffffffffffffe50;
  vector<int,_std::allocator<int>_> *count_00;
  int in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  SourceLineInfo local_178;
  StringRef local_168;
  double local_110;
  ExprLhs<bool> local_101;
  undefined8 local_100;
  int local_dc;
  longdouble local_d8;
  int local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  int local_78;
  undefined1 local_65 [29];
  vector<long_double,_std::allocator<long_double>_> local_48;
  undefined4 local_2c;
  longdouble local_28;
  undefined4 local_c;
  
  local_c = 0x80;
  local_28 = (longdouble)0.0078125;
  local_2c = 10000;
  lVar6 = in_ST6;
  std::vector<long_double,_std::allocator<long_double>_>::vector
            ((vector<long_double,_std::allocator<long_double>_> *)0x3630bf);
  local_65._1_4_ = 0;
  count_00 = (vector<int,_std::allocator<int>_> *)local_65;
  std::allocator<int>::allocator((allocator<int> *)0x3630dc);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38,
             (value_type_conflict3 *)
             CONCAT17(in_stack_fffffffffffffe37,
                      CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
             (allocator_type *)in_stack_fffffffffffffe28);
  std::allocator<int>::~allocator((allocator<int> *)0x36310a);
  for (local_78 = 1; local_78 < 0x80; local_78 = local_78 + 1) {
    lVar6 = (longdouble)0.0078125 * (longdouble)local_78;
    in_stack_fffffffffffffe18 = SUB104(lVar6,0);
    in_stack_fffffffffffffe1c = (Flags)((unkuint10)lVar6 >> 0x20);
    in_stack_fffffffffffffe20 = (undefined2)((unkuint10)lVar6 >> 0x40);
    x_00._8_4_ = in_stack_fffffffffffffe18;
    x_00._0_8_ = 0x36314f;
    x_00._12_4_ = in_stack_fffffffffffffe1c;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST6 = in_ST5;
    in_stack_fffffffffffffe70 = local_78;
    trng::uniform01_dist<long_double>::icdf
              ((uniform01_dist<long_double> *)in_stack_fffffffffffffe28,(result_type_conflict3)x_00)
    ;
    lVar6 = in_ST6;
    std::vector<long_double,_std::allocator<long_double>_>::push_back
              ((vector<long_double,_std::allocator<long_double>_> *)
               CONCAT62(in_stack_fffffffffffffe22,in_stack_fffffffffffffe20),
               (value_type_conflict7 *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)
              );
  }
  local_b8 = trng::lcg64_shift::Default;
  uStack_b0 = DAT_005526e8;
  P.a._4_4_ = in_stack_fffffffffffffe1c;
  P.a._0_4_ = in_stack_fffffffffffffe18;
  P.b._0_2_ = in_stack_fffffffffffffe20;
  P.b._2_6_ = in_stack_fffffffffffffe22;
  trng::lcg64_shift::lcg64_shift((lcg64_shift *)0x3631f0,P);
  for (local_bc = 0; this_00 = SUB108(in_stack_fffffffffffffe50,0), local_bc < 10000;
      local_bc = local_bc + 1) {
    trng::uniform01_dist<long_double>::operator()
              ((uniform01_dist<long_double> *)
               CONCAT62(in_stack_fffffffffffffe22,in_stack_fffffffffffffe20),
               (lcg64_shift *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    local_dc = 0;
    lVar2 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = in_ST6;
    in_ST6 = lVar6;
    local_d8 = in_ST0;
    while( true ) {
      in_ST0 = lVar2;
      bVar1 = false;
      if (local_dc < 0x7f) {
        in_stack_fffffffffffffe50 = local_d8;
        pvVar4 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                           (&local_48,(long)local_dc);
        bVar1 = *(longdouble *)pvVar4 < in_stack_fffffffffffffe50;
        in_ST6 = in_ST5;
        lVar6 = in_ST5;
      }
      if (!bVar1) break;
      local_dc = local_dc + 1;
      lVar2 = in_ST0;
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_65 + 5),(long)local_dc);
    *pvVar5 = *pvVar5 + 1;
  }
  local_100 = 0x3f80000000000000;
  expr = &local_101;
  std::allocator<double>::allocator((allocator<double> *)0x3632f5);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
             (value_type_conflict6 *)
             CONCAT17(in_stack_fffffffffffffe37,
                      CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
             (allocator_type *)in_stack_fffffffffffffe28);
  std::allocator<double>::~allocator((allocator<double> *)0x363323);
  dVar8 = chi_percentil((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),count_00);
  local_110 = dVar8;
  local_168 = operator____catch_sr
                        ((char *)CONCAT62(in_stack_fffffffffffffe22,in_stack_fffffffffffffe20),
                         CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  this = &local_178;
  Catch::SourceLineInfo::SourceLineInfo
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0xc2);
  Catch::StringRef::StringRef
            ((StringRef *)
             CONCAT17(in_stack_fffffffffffffe37,
                      CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
             (char *)in_stack_fffffffffffffe28);
  capturedExpression.m_size = (size_type)dVar8;
  capturedExpression.m_start = (char *)this;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffe37,
                      CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
             in_stack_fffffffffffffe28,
             (SourceLineInfo *)CONCAT62(in_stack_fffffffffffffe22,in_stack_fffffffffffffe20),
             capturedExpression,in_stack_fffffffffffffe1c);
  uVar7 = 0.01 < local_110 && local_110 < 0.99;
  EVar3 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                     false);
  Catch::AssertionHandler::handleExpr<bool>(this_00,expr);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)CONCAT62(in_stack_fffffffffffffe22,in_stack_fffffffffffffe20));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT62(in_stack_fffffffffffffe22,in_stack_fffffffffffffe20));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(uVar7,CONCAT16(EVar3.m_lhs,in_stack_fffffffffffffe30)));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(uVar7,CONCAT16(EVar3.m_lhs,in_stack_fffffffffffffe30)));
  std::vector<long_double,_std::allocator<long_double>_>::~vector
            ((vector<long_double,_std::allocator<long_double>_> *)
             CONCAT17(uVar7,CONCAT16(EVar3.m_lhs,in_stack_fffffffffffffe30)));
  return;
}

Assistant:

void continuous_dist_test_chi2_test(dist &d) {
  using result_type = typename dist::result_type;
  const int bins{128};
  const result_type dp{result_type(1) / result_type(bins)};
  const int N{10000};
  std::vector<result_type> quantil;
  std::vector<int> count(bins, 0);
  for (int i{1}; i < bins; ++i)
    quantil.push_back(d.icdf(dp * i));
  trng::lcg64_shift R;
  for (int i{0}; i < N; ++i) {
    const result_type x{d(R)};
    int bin{0};
    while (bin < bins - 1 and x > quantil[bin])
      ++bin;
    ++count[bin];
  }
  const std::vector<double> p(bins, 1.0 / bins);
  const double c2_p{chi_percentil(p, count)};
  REQUIRE((0.01 < c2_p and c2_p < 0.99));
}